

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_spec_constant_default_value_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::SetSpecConstantDefaultValuePass::Process(SetSpecConstantDefaultValuePass *this)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  Status SVar5;
  DefUseManager *pDVar6;
  size_type sVar7;
  char *text;
  IRContext *pIVar8;
  TypeManager *pTVar9;
  Type *pTVar10;
  pointer pvVar11;
  Operand *pOVar12;
  reference pvVar13;
  SmallVector<unsigned_int,_2UL> local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  local_d0;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  local_c8;
  const_iterator iter_1;
  string *default_value_str;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_98;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_90;
  const_iterator iter;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bit_pattern;
  Instruction *target_inst;
  Instruction *spec_inst;
  uint32_t target_id;
  uint32_t spec_id;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  bool modified;
  uint32_t kOpSpecConstantLiteralInOperandIndex;
  uint32_t kOpDecorateSpecIdNumOperands;
  uint32_t kSpecIdLiteralOperandIndex;
  uint32_t kDecorationOperandIndex;
  uint32_t kTargetIdOperandIndex;
  SetSpecConstantDefaultValuePass *this_local;
  
  bVar1 = false;
  Pass::context(&this->super_Pass);
  IRContext::annotations((IRContext *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
  do {
    bVar2 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst);
    if (!bVar2) {
      SVar5 = SuccessWithoutChange;
      if (bVar1) {
        SVar5 = SuccessWithChange;
      }
      return SVar5;
    }
    _target_id = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar3 = opt::Instruction::opcode(_target_id);
    if (((OVar3 == OpDecorate) && (uVar4 = opt::Instruction::NumOperands(_target_id), uVar4 == 3))
       && (uVar4 = opt::Instruction::GetSingleWordInOperand(_target_id,1), uVar4 == 1)) {
      spec_inst._4_4_ = opt::Instruction::GetSingleWordOperand(_target_id,2);
      spec_inst._0_4_ = opt::Instruction::GetSingleWordOperand(_target_id,0);
      pDVar6 = Pass::get_def_use_mgr(&this->super_Pass);
      target_inst = analysis::DefUseManager::GetDef(pDVar6,(uint32_t)spec_inst);
      if (target_inst != (Instruction *)0x0) {
        OVar3 = opt::Instruction::opcode(target_inst);
        if (OVar3 == OpDecorationGroup) {
          pDVar6 = Pass::get_def_use_mgr(&this->super_Pass);
          target_inst = anon_unknown_7::GetSpecIdTargetFromDecorationGroup(target_inst,pDVar6);
        }
        if (target_inst != (Instruction *)0x0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter);
          sVar7 = std::
                  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::size(&this->spec_id_to_value_str_);
          if (sVar7 == 0) {
            local_c8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::find(&this->spec_id_to_value_bit_pattern_,(key_type *)((long)&spec_inst + 4));
            local_d0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::end(&this->spec_id_to_value_bit_pattern_);
            bVar2 = std::__detail::operator==(&local_c8,&local_d0);
            if (!bVar2) {
              pvVar11 = std::__detail::
                        _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
                        ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
                                      *)&local_c8);
              pIVar8 = Pass::context(&this->super_Pass);
              pTVar9 = IRContext::get_type_mgr(pIVar8);
              uVar4 = opt::Instruction::type_id(target_inst);
              pTVar10 = analysis::TypeManager::GetType(pTVar9,uVar4);
              anon_unknown_7::ParseDefaultValueBitPattern(&local_e8,&pvVar11->second,pTVar10);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter,&local_e8);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e8);
              goto LAB_00831b38;
            }
          }
          else {
            local_90._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&this->spec_id_to_value_str_,(key_type *)((long)&spec_inst + 4));
            local_98._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(&this->spec_id_to_value_str_);
            bVar2 = std::__detail::operator==(&local_90,&local_98);
            if (!bVar2) {
              std::__detail::
              _Node_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
              ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                            *)&local_90);
              text = (char *)std::__cxx11::string::c_str();
              pIVar8 = Pass::context(&this->super_Pass);
              pTVar9 = IRContext::get_type_mgr(pIVar8);
              uVar4 = opt::Instruction::type_id(target_inst);
              pTVar10 = analysis::TypeManager::GetType(pTVar9,uVar4);
              anon_unknown_7::ParseDefaultValueStr
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1,text,pTVar10
                        );
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter_1);
LAB_00831b38:
              bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter);
              if (!bVar2) {
                OVar3 = opt::Instruction::opcode(target_inst);
                if (OVar3 == OpSpecConstantTrue) {
                  pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter)
                  ;
                  if (*pvVar13 == 0) {
                    opt::Instruction::SetOpcode(target_inst,OpSpecConstantFalse);
                    bVar1 = true;
                  }
                }
                else if (OVar3 == OpSpecConstantFalse) {
                  pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter)
                  ;
                  if (*pvVar13 != 0) {
                    opt::Instruction::SetOpcode(target_inst,OpSpecConstantTrue);
                    bVar1 = true;
                  }
                }
                else if (OVar3 == OpSpecConstant) {
                  pOVar12 = opt::Instruction::GetInOperand(target_inst,0);
                  bVar2 = utils::operator!=(&pOVar12->words,
                                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                            &iter);
                  if (bVar2) {
                    utils::SmallVector<unsigned_int,_2UL>::SmallVector
                              (&local_110,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter);
                    opt::Instruction::SetInOperand(target_inst,0,&local_110);
                    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_110);
                    bVar1 = true;
                  }
                }
              }
            }
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iter);
        }
      }
    }
    InstructionList::iterator::operator++(&__end2);
  } while( true );
}

Assistant:

Pass::Status SetSpecConstantDefaultValuePass::Process() {
  // The operand index of decoration target in an OpDecorate instruction.
  constexpr uint32_t kTargetIdOperandIndex = 0;
  // The operand index of the decoration literal in an OpDecorate instruction.
  constexpr uint32_t kDecorationOperandIndex = 1;
  // The operand index of Spec id literal value in an OpDecorate SpecId
  // instruction.
  constexpr uint32_t kSpecIdLiteralOperandIndex = 2;
  // The number of operands in an OpDecorate SpecId instruction.
  constexpr uint32_t kOpDecorateSpecIdNumOperands = 3;
  // The in-operand index of the default value in a OpSpecConstant instruction.
  constexpr uint32_t kOpSpecConstantLiteralInOperandIndex = 0;

  bool modified = false;
  // Scan through all the annotation instructions to find 'OpDecorate SpecId'
  // instructions. Then extract the decoration target of those instructions.
  // The decoration targets should be spec constant defining instructions with
  // opcode: OpSpecConstant{|True|False}. The spec id of those spec constants
  // will be used to look up their new default values in the mapping from
  // spec id to new default value strings. Once a new default value string
  // is found for a spec id, the string will be parsed according to the target
  // spec constant type. The parsed value will be used to replace the original
  // default value of the target spec constant.
  for (Instruction& inst : context()->annotations()) {
    // Only process 'OpDecorate SpecId' instructions
    if (inst.opcode() != spv::Op::OpDecorate) continue;
    if (inst.NumOperands() != kOpDecorateSpecIdNumOperands) continue;
    if (inst.GetSingleWordInOperand(kDecorationOperandIndex) !=
        uint32_t(spv::Decoration::SpecId)) {
      continue;
    }

    // 'inst' is an OpDecorate SpecId instruction.
    uint32_t spec_id = inst.GetSingleWordOperand(kSpecIdLiteralOperandIndex);
    uint32_t target_id = inst.GetSingleWordOperand(kTargetIdOperandIndex);

    // Find the spec constant defining instruction. Note that the
    // target_id might be a decoration group id.
    Instruction* spec_inst = nullptr;
    if (Instruction* target_inst = get_def_use_mgr()->GetDef(target_id)) {
      if (target_inst->opcode() == spv::Op::OpDecorationGroup) {
        spec_inst =
            GetSpecIdTargetFromDecorationGroup(*target_inst, get_def_use_mgr());
      } else {
        spec_inst = target_inst;
      }
    } else {
      continue;
    }
    if (!spec_inst) continue;

    // Get the default value bit pattern for this spec id.
    std::vector<uint32_t> bit_pattern;

    if (spec_id_to_value_str_.size() != 0) {
      // Search for the new string-form default value for this spec id.
      auto iter = spec_id_to_value_str_.find(spec_id);
      if (iter == spec_id_to_value_str_.end()) {
        continue;
      }

      // Gets the string of the default value and parses it to bit pattern
      // with the type of the spec constant.
      const std::string& default_value_str = iter->second;
      bit_pattern = ParseDefaultValueStr(
          default_value_str.c_str(),
          context()->get_type_mgr()->GetType(spec_inst->type_id()));

    } else {
      // Search for the new bit-pattern-form default value for this spec id.
      auto iter = spec_id_to_value_bit_pattern_.find(spec_id);
      if (iter == spec_id_to_value_bit_pattern_.end()) {
        continue;
      }

      // Gets the bit-pattern of the default value from the map directly.
      bit_pattern = ParseDefaultValueBitPattern(
          iter->second,
          context()->get_type_mgr()->GetType(spec_inst->type_id()));
    }

    if (bit_pattern.empty()) continue;

    // Update the operand bit patterns of the spec constant defining
    // instruction.
    switch (spec_inst->opcode()) {
      case spv::Op::OpSpecConstant:
        // If the new value is the same with the original value, no
        // need to do anything. Otherwise update the operand words.
        if (spec_inst->GetInOperand(kOpSpecConstantLiteralInOperandIndex)
                .words != bit_pattern) {
          spec_inst->SetInOperand(kOpSpecConstantLiteralInOperandIndex,
                                  std::move(bit_pattern));
          modified = true;
        }
        break;
      case spv::Op::OpSpecConstantTrue:
        // If the new value is also 'true', no need to change anything.
        // Otherwise, set the opcode to OpSpecConstantFalse;
        if (!static_cast<bool>(bit_pattern.front())) {
          spec_inst->SetOpcode(spv::Op::OpSpecConstantFalse);
          modified = true;
        }
        break;
      case spv::Op::OpSpecConstantFalse:
        // If the new value is also 'false', no need to change anything.
        // Otherwise, set the opcode to OpSpecConstantTrue;
        if (static_cast<bool>(bit_pattern.front())) {
          spec_inst->SetOpcode(spv::Op::OpSpecConstantTrue);
          modified = true;
        }
        break;
      default:
        break;
    }
    // No need to update the DefUse manager, as this pass does not change any
    // ids.
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}